

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

char * Ses_ManFindMinimumSize(Ses_Man_t *pSes)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  char *pSol;
  char *local_30;
  
  iVar5 = pSes->nSpecFunc;
  if (1 < iVar5) {
    uVar11 = pSes->nStartGates;
    do {
      uVar11 = uVar11 + 1;
      if (pSes->fVerbose != 0) {
        printf("try with %d gates\n",(ulong)uVar11);
      }
      *(undefined4 *)(pSes->pTtValues + 2) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0x14) = 0xffffffff;
      *(undefined4 *)(pSes->pTtValues + 3) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0x1c) = 0xffffffff;
      *(undefined4 *)pSes->pTtValues = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 4) = 0xffffffff;
      *(undefined4 *)(pSes->pTtValues + 1) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0xc) = 0xffffffff;
      iVar5 = Ses_ManFindNetworkExact(pSes,uVar11);
    } while (iVar5 == 2);
    if (iVar5 == 0) {
      return (char *)0x0;
    }
    pcVar7 = Ses_ManExtractSolution(pSes);
    return pcVar7;
  }
  uVar11 = pSes->nMaxDepth;
  uVar12 = (ulong)uVar11;
  if ((uVar11 == 0xffffffff) || (piVar1 = pSes->pArrTimeProfile, piVar1 == (int *)0x0))
  goto LAB_002bb9a6;
  iVar15 = 0;
  pSes->vStairDecVars->nSize = 0;
  pSes->fDecStructure = 0;
  uVar14 = pSes->nSpecVars;
  uVar6 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
LAB_002bb8a7:
    iVar5 = (uVar14 == 4) + 3;
    bVar2 = 0;
  }
  else {
    uVar10 = 0;
    do {
      uVar13 = piVar1[uVar10];
      uVar8 = (ulong)uVar13;
      if ((int)uVar11 <= (int)uVar13) {
        if (pSes->fReasonVerbose == 0) {
          return (char *)0x0;
        }
        pcVar7 = 
        "give up due to impossible arrival time (depth = %d, input = %d, arrival time = %d)";
        goto LAB_002bbbfe;
      }
      if ((iVar5 == 1) && (uVar13 + 1 == uVar11)) {
        if ((iVar15 == 2) || (2 < uVar14 && iVar15 == 1)) {
          if (pSes->fReasonVerbose == 0) {
            return (char *)0x0;
          }
          pcVar7 = 
          "give up due to impossible decomposition (depth = %d, input = %d, arrival time = %d)";
          goto LAB_002bbbfe;
        }
        iVar15 = iVar15 + 1;
        pSes->fDecStructure = iVar15;
        if (((uint)pSes->pDecVars >> ((uint)uVar10 & 0x1f) & 1) == 0) {
          if (pSes->fReasonVerbose == 0) {
            return (char *)0x0;
          }
          uVar8 = (ulong)(uint)piVar1[uVar10];
          pcVar7 = 
          "give up due to impossible decomposition (depth = %d, input = %d, arrival time = %d)";
          goto LAB_002bbbfe;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
    if (iVar15 == 0) goto LAB_002bb8a7;
    uVar12 = 1;
    do {
      uVar10 = uVar12;
      uVar14 = (uint)uVar6;
      if ((int)uVar14 < 1) break;
      iVar5 = (int)uVar10;
      lVar16 = 0;
      iVar15 = 0;
      do {
        if (pSes->pArrTimeProfile[lVar16] + iVar5 == pSes->nMaxDepth) {
          if (iVar15 == 0) {
            Vec_IntPush(pSes->vStairDecVars,(int)lVar16);
            uVar6 = (ulong)(uint)pSes->nSpecVars;
          }
          else {
            if (iVar5 != pSes->vStairDecVars->nSize) {
              __assert_fail("nLevel == Vec_IntSize( pSes->vStairDecVars )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,0x806,"int Ses_CheckDepthConsistency(Ses_Man_t *)");
            }
            if ((1 < iVar15) || ((int)(iVar5 + 1U) < (int)uVar6)) {
              if (pSes->fReasonVerbose == 0) {
                return (char *)0x0;
              }
              printf("give up due to impossible decomposition at level %d",uVar10);
              return (char *)0x0;
            }
          }
          iVar15 = iVar15 + 1;
        }
        lVar16 = lVar16 + 1;
        uVar14 = (uint)uVar6;
      } while (lVar16 < (int)uVar14);
      uVar12 = (ulong)(iVar5 + 1U);
    } while (iVar15 != 0);
    iVar5 = pSes->vStairDecVars->nSize;
    if (iVar5 != 0) {
      iVar5 = Abc_TtIsStairDecomposable
                        (pSes->pSpec,pSes->nSpecWords,pSes->vStairDecVars->pArray,iVar5,
                         pSes->pStairDecFunc);
      if (iVar5 == 0) {
        if (pSes->fReasonVerbose == 0) {
          return (char *)0x0;
        }
        printf("give up due to impossible stair decomposition at level %d: ",uVar10);
        Vec_IntPrint(pSes->vStairDecVars);
        return (char *)0x0;
      }
      uVar14 = pSes->nSpecVars;
    }
    if (pSes->fDecStructure == 0) goto LAB_002bb8a7;
    iVar5 = (uVar14 == 3) + 1;
    bVar2 = 1;
  }
  if ((int)uVar14 < 1) {
    pSes->nMaxGates = 0;
  }
  else {
    uVar6 = (ulong)uVar14;
    uVar11 = pSes->nMaxDepth;
    uVar12 = (ulong)uVar11;
    uVar10 = 0;
    iVar15 = 0;
    do {
      uVar13 = pSes->pArrTimeProfile[uVar10];
      uVar8 = (ulong)uVar13;
      if (uVar13 + 2 == uVar11) {
        if (iVar5 <= iVar15) {
          if (pSes->fReasonVerbose == 0) {
            return (char *)0x0;
          }
          pcVar7 = 
          "give up due to impossible decomposition at second level (depth = %d, input = %d, arrival time = %d)"
          ;
          goto LAB_002bbbfe;
        }
        iVar15 = iVar15 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
    if ((bool)(4 < (int)uVar14 & bVar2 & iVar15 == 1)) {
      uVar10 = 0;
      bVar3 = false;
      do {
        uVar13 = pSes->pArrTimeProfile[uVar10];
        uVar8 = (ulong)uVar13;
        bVar4 = bVar3;
        if ((uVar13 + 3 == uVar11) && (bVar4 = true, bVar3)) {
          if (pSes->fReasonVerbose == 0) {
            return (char *)0x0;
          }
          pcVar7 = 
          "give up due to impossible decomposition at third level (depth = %d, input = %d, arrival time = %d)"
          ;
LAB_002bbbfe:
          printf(pcVar7,uVar12,uVar10,uVar8);
          return (char *)0x0;
        }
        bVar3 = bVar4;
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    pSes->nMaxGates = 0;
    if ((uVar11 != 0) && (0 < (int)uVar14)) {
      iVar5 = 1;
      iVar15 = 0;
      do {
        uVar10 = 0;
        do {
          uVar11 = uVar14;
          iVar9 = iVar5;
          uVar14 = (uint)(pSes->pArrTimeProfile[uVar10] == (int)uVar12);
          iVar5 = iVar9 - uVar14;
          uVar14 = uVar11 - uVar14;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
        iVar15 = iVar15 + iVar5;
        pSes->nMaxGates = iVar15;
      } while (((iVar5 != 0) && (uVar13 = (int)uVar12 - 1, uVar12 = (ulong)uVar13, uVar13 != 0)) &&
              (iVar5 = iVar5 * 2, iVar9 < (int)uVar11));
    }
  }
LAB_002bb9a6:
  uVar11 = pSes->nStartGates;
  local_30 = (char *)0x0;
  pSes->fHitResLimit = 0;
  pSes->nDebugOffset = 9 < pSes->nMaxGates | 2;
  iVar5 = pSes->vStairDecVars->nSize;
  uVar14 = iVar5 - 1;
  if ((int)uVar14 < (int)uVar11) {
    uVar14 = uVar11;
  }
  if (iVar5 == 0) {
    uVar14 = uVar11;
  }
  uVar12 = (ulong)uVar14;
  pSes->pTtValues[2] = 0;
  pSes->pTtValues[3] = 0;
  pSes->pTtValues[0] = 0;
  pSes->pTtValues[1] = 0;
  if (pSes->fVeryVerbose != 0) {
    printf(" (%d/%d)",uVar12);
    fflush(_stdout);
  }
  do {
    iVar5 = (int)uVar12;
    uVar11 = iVar5 + 1;
    uVar12 = (ulong)uVar11;
    uVar11 = Ses_ManFindNetworkExactCEGAR(pSes,uVar11,&local_30);
    if (uVar11 == 0) {
      pSes->fHitResLimit = 1;
      break;
    }
  } while ((uVar11 & 1) == 0);
  if (pSes->fVeryVerbose != 0) {
    iVar5 = pSes->nDebugOffset + (uint)(8 < iVar5) + 4;
    if (0 < iVar5) {
      do {
        putchar(8);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    fflush(_stdout);
  }
  if (local_30 != (char *)0x0) {
    return local_30;
  }
  if ((pSes->nMaxDepth != -1) && (pSes->fHitResLimit != 0)) {
    uVar11 = pSes->nMaxGates;
    if (pSes->nGates != uVar11) {
      local_30 = (char *)0x0;
      pSes->fHitResLimit = 0;
      if (pSes->fVeryVerbose != 0) {
        printf(" (%d/%d)",(ulong)uVar11,(ulong)uVar11);
        fflush(_stdout);
      }
      uVar14 = pSes->nGates + 1;
      while (pcVar7 = local_30, iVar5 = Ses_ManFindNetworkExactCEGAR(pSes,uVar11,&local_30),
            iVar5 == 1) {
        pcVar7 = local_30;
        if (uVar14 == uVar11) goto LAB_002bbbab;
        uVar11 = uVar11 - 1;
      }
      uVar14 = uVar11;
      if (iVar5 == 0) {
        pSes->fHitResLimit = 1;
      }
LAB_002bbbab:
      if (pSes->fVeryVerbose != 0) {
        iVar5 = pSes->nDebugOffset + (uint)(9 < (int)uVar14) + 4;
        if (0 < iVar5) {
          do {
            putchar(8);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        fflush(_stdout);
      }
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

static char * Ses_ManFindMinimumSize( Ses_Man_t * pSes )
{
    char * pSol = NULL;
    int i = pSes->nStartGates + 1, fRes;

    /* if more than one function, no CEGAR */
    if ( pSes->nSpecFunc > 1 )
    {
      while ( true )
      {
        if ( pSes->fVerbose )
        {
          printf( "try with %d gates\n", i );
        }

        memset( pSes->pTtValues, ~0, 4 * sizeof( word ) );
        fRes = Ses_ManFindNetworkExact( pSes, i++ );
        if ( fRes == 2 ) continue;
        if ( fRes == 0 ) break;

        pSol = Ses_ManExtractSolution( pSes );
        break;
      }

      return pSol;
    }

    /* do the arrival times allow for a network? */
    if ( pSes->nMaxDepth != -1 && pSes->pArrTimeProfile )
    {
        if ( !Ses_CheckDepthConsistency( pSes ) )
            return 0;
        Ses_ManComputeMaxGates( pSes );
    }

    pSol = Ses_ManFindMinimumSizeBottomUp( pSes );

    if ( !pSol && pSes->nMaxDepth != -1 && pSes->fHitResLimit && pSes->nGates != pSes->nMaxGates )
        return Ses_ManFindMinimumSizeTopDown( pSes, pSes->nGates + 1 );
    else
        return pSol;
}